

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SoftHSM.cpp
# Opt level: O0

CK_RV __thiscall
SoftHSM::generateDSAParameters
          (SoftHSM *this,CK_SESSION_HANDLE hSession,CK_ATTRIBUTE_PTR pTemplate,CK_ULONG ulCount,
          CK_OBJECT_HANDLE_PTR phKey,CK_BBOOL isOnToken,CK_BBOOL isPrivate)

{
  long lVar1;
  OSAttribute *pOVar2;
  HandleManager *this_00;
  int iVar3;
  uint uVar4;
  CryptoFactory *pCVar5;
  undefined4 extraout_var;
  ulong uVar6;
  ByteString *pBVar7;
  long *plVar8;
  ulong in_RCX;
  undefined8 *puVar9;
  long in_RDX;
  long *in_R8;
  bool bVar10;
  char in_stack_00000008;
  OSObject *osparams;
  int in_stack_00000144;
  CK_OBJECT_HANDLE_PTR in_stack_00000148;
  CK_ULONG in_stack_00000150;
  CK_ATTRIBUTE_PTR in_stack_00000158;
  CK_SESSION_HANDLE in_stack_00000160;
  SoftHSM *in_stack_00000168;
  ByteString generator;
  ByteString subprime;
  ByteString prime;
  CK_ULONG ulKeyGenMechanism;
  bool bOK;
  OSObject *osobject;
  CK_ULONG i_1;
  CK_ULONG paramsAttribsCount;
  CK_ATTRIBUTE paramsAttribs [32];
  CK_KEY_TYPE keyType;
  CK_OBJECT_CLASS objClass;
  CK_ULONG maxAttribs;
  CK_RV rv;
  DSAParameters *params;
  AsymmetricAlgorithm *dsa;
  AsymmetricParameters *p;
  CK_ULONG i;
  size_t qLen;
  size_t bitLen;
  Token *token;
  Session *session;
  undefined6 in_stack_fffffffffffff788;
  undefined1 in_stack_fffffffffffff78e;
  undefined1 in_stack_fffffffffffff78f;
  OSAttribute *in_stack_fffffffffffff790;
  byte local_862;
  byte local_852;
  uint7 in_stack_fffffffffffff7b8;
  byte bVar11;
  OSAttribute *in_stack_fffffffffffff7c0;
  ByteString *in_stack_fffffffffffff7d0;
  HandleManager *in_stack_fffffffffffff7d8;
  HandleManager *in_stack_fffffffffffff7e8;
  HandleManager *in_stack_fffffffffffff7f0;
  byte local_7e1;
  undefined8 *local_7b0;
  undefined1 local_788 [167];
  byte local_6e1;
  undefined1 local_6e0 [167];
  byte local_639;
  undefined1 local_638 [136];
  undefined1 local_570 [40];
  undefined1 local_548 [47];
  byte local_519;
  undefined1 local_518 [160];
  undefined8 local_478;
  byte local_459;
  undefined1 local_458 [167];
  byte local_3b1;
  OSAttribute *local_3b0;
  ulong local_3a8;
  long local_3a0;
  undefined1 *local_398 [5];
  undefined8 local_370;
  undefined8 local_368;
  undefined1 *local_360;
  undefined8 local_358;
  undefined8 local_350;
  undefined8 *local_348;
  undefined8 local_340;
  undefined8 local_338 [84];
  undefined8 local_98;
  undefined8 local_90;
  undefined8 local_88;
  CK_RV local_80;
  DSAParameters *local_78;
  long *local_70;
  DSAParameters *local_68;
  ulong local_60;
  long local_58;
  ulong local_50;
  HandleManager *local_48;
  Session *local_40;
  undefined1 local_31;
  long *local_30;
  ulong local_28;
  long local_20;
  CK_RV local_8;
  
  *in_R8 = 0;
  local_30 = in_R8;
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_40 = (Session *)
             HandleManager::getSession
                       (in_stack_fffffffffffff7d8,(CK_SESSION_HANDLE)in_stack_fffffffffffff7d0);
  if (local_40 == (Session *)0x0) {
    local_8 = 0xb3;
  }
  else {
    local_48 = (HandleManager *)Session::getToken(local_40);
    if (local_48 == (HandleManager *)0x0) {
      local_8 = 5;
    }
    else {
      local_50 = 0;
      local_58 = 0;
      for (local_60 = 0; local_60 < local_28; local_60 = local_60 + 1) {
        lVar1 = *(long *)(local_20 + local_60 * 0x18);
        if (lVar1 == 0x133) {
          if (*(long *)(local_20 + local_60 * 0x18 + 0x10) != 8) {
            softHSMLog(6,"generateDSAParameters",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x22fe,"CKA_PRIME_BITS does not have the size of CK_ULONG");
            return 0x13;
          }
          local_50 = **(ulong **)(local_20 + local_60 * 0x18 + 8);
        }
        else if (lVar1 == 0x134) {
          if (*(long *)(local_20 + local_60 * 0x18 + 0x10) != 8) {
            softHSMLog(6,"generateDSAParameters",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x2306,"CKA_SUB_PRIME_BITS does not have the size of CK_ULONG");
            return 0x13;
          }
          local_58 = **(long **)(local_20 + local_60 * 0x18 + 8);
        }
      }
      if (local_50 == 0) {
        softHSMLog(6,"generateDSAParameters",
                   "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                   ,0x2313,"Missing CKA_PRIME_BITS in pTemplate");
        local_8 = 0xd0;
      }
      else {
        if ((local_58 != 0) &&
           (((0x7ff < local_50 && (local_58 != 0x100)) || ((local_50 < 0x800 && (local_58 != 0xa0)))
            ))) {
          softHSMLog(6,"generateDSAParameters",
                     "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                     ,0x231b,"CKA_SUB_PRIME_BITS is ignored");
        }
        local_68 = (DSAParameters *)0x0;
        pCVar5 = CryptoFactory::i();
        iVar3 = (*pCVar5->_vptr_CryptoFactory[2])(pCVar5,2);
        local_70 = (long *)CONCAT44(extraout_var,iVar3);
        if (local_70 == (long *)0x0) {
          local_8 = 5;
        }
        else {
          uVar6 = (**(code **)(*local_70 + 0x78))(local_70,&local_68,local_50,0);
          if ((uVar6 & 1) == 0) {
            softHSMLog(3,"generateDSAParameters",
                       "/workspace/llm4binary/github/license_c_cmakelists/opendnssec[P]SoftHSMv2/src/lib/SoftHSM.cpp"
                       ,0x2324,"Could not generate parameters");
            pCVar5 = CryptoFactory::i();
            (*pCVar5->_vptr_CryptoFactory[3])(pCVar5,local_70);
            local_8 = 5;
          }
          else {
            local_78 = local_68;
            local_80 = 0;
            local_88 = 0x20;
            local_90 = 6;
            local_98 = 1;
            memset(local_398,0,0x300);
            local_398[1] = (undefined1 *)&local_90;
            local_398[2] = (undefined1 *)0x8;
            local_398[3] = (undefined1 *)0x1;
            local_398[4] = &local_31;
            local_370 = 1;
            local_368 = 2;
            local_360 = &stack0x00000008;
            local_358 = 1;
            local_350 = 0x100;
            local_348 = &local_98;
            local_340 = 8;
            local_7b0 = local_338;
            do {
              local_7b0 = local_7b0 + 3;
            } while (local_7b0 != &local_98);
            local_3a0 = 4;
            if (0x1c < local_28) {
              local_80 = 0xd1;
            }
            for (local_3a8 = 0; local_3a8 < local_28 && local_80 == 0; local_3a8 = local_3a8 + 1) {
              uVar6 = *(ulong *)(local_20 + local_3a8 * 0x18);
              if ((2 < uVar6) && (uVar6 != 0x100)) {
                puVar9 = (undefined8 *)(local_20 + local_3a8 * 0x18);
                local_398[local_3a0 * 3] = (undefined1 *)*puVar9;
                local_398[local_3a0 * 3 + 1] = (undefined1 *)puVar9[1];
                local_398[local_3a0 * 3 + 2] = (undefined1 *)puVar9[2];
                local_3a0 = local_3a0 + 1;
              }
            }
            if (local_80 == 0) {
              local_80 = CreateObject(in_stack_00000168,in_stack_00000160,in_stack_00000158,
                                      in_stack_00000150,in_stack_00000148,in_stack_00000144);
            }
            if (local_80 == 0) {
              local_3b0 = (OSAttribute *)
                          HandleManager::getObject
                                    (in_stack_fffffffffffff7d8,
                                     (CK_OBJECT_HANDLE)in_stack_fffffffffffff7d0);
              if ((local_3b0 == (OSAttribute *)0x0) ||
                 (uVar4 = (*local_3b0->_vptr_OSAttribute[10])(), (uVar4 & 1) == 0)) {
                local_80 = 6;
              }
              else {
                uVar4 = (*local_3b0->_vptr_OSAttribute[0xb])(local_3b0,1);
                pOVar2 = local_3b0;
                if ((uVar4 & 1) == 0) {
                  local_80 = 6;
                }
                else {
                  local_3b1 = 1;
                  local_459 = 0;
                  OSAttribute::OSAttribute
                            (in_stack_fffffffffffff790,(bool)in_stack_fffffffffffff78f);
                  local_459 = 1;
                  iVar3 = (*pOVar2->_vptr_OSAttribute[8])(pOVar2,0x163,local_458);
                  local_3b1 = (byte)iVar3 & 1;
                  if ((local_459 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_fffffffffffff790);
                  }
                  pOVar2 = local_3b0;
                  local_478 = 0x2000;
                  local_519 = 0;
                  local_7e1 = 0;
                  if ((local_3b1 & 1) != 0) {
                    OSAttribute::OSAttribute
                              (in_stack_fffffffffffff790,
                               CONCAT17(in_stack_fffffffffffff78f,
                                        CONCAT16(in_stack_fffffffffffff78e,in_stack_fffffffffffff788
                                                )));
                    local_519 = 1;
                    iVar3 = (*pOVar2->_vptr_OSAttribute[8])(pOVar2,0x166,local_518);
                    local_7e1 = (byte)iVar3;
                  }
                  local_3b1 = local_7e1 & 1;
                  if ((local_519 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_fffffffffffff790);
                  }
                  ByteString::ByteString((ByteString *)0x175af5);
                  ByteString::ByteString((ByteString *)0x175b02);
                  ByteString::ByteString((ByteString *)0x175b11);
                  this_00 = local_48;
                  if (in_stack_00000008 == '\0') {
                    in_stack_fffffffffffff7d0 = DSAParameters::getP(local_78);
                    ByteString::operator=
                              ((ByteString *)in_stack_fffffffffffff790,
                               (ByteString *)
                               CONCAT17(in_stack_fffffffffffff78f,
                                        CONCAT16(in_stack_fffffffffffff78e,in_stack_fffffffffffff788
                                                )));
                    DSAParameters::getQ(local_78);
                    ByteString::operator=
                              ((ByteString *)in_stack_fffffffffffff790,
                               (ByteString *)
                               CONCAT17(in_stack_fffffffffffff78f,
                                        CONCAT16(in_stack_fffffffffffff78e,in_stack_fffffffffffff788
                                                )));
                    in_stack_fffffffffffff7c0 = (OSAttribute *)DSAParameters::getG(local_78);
                    ByteString::operator=
                              ((ByteString *)in_stack_fffffffffffff790,
                               (ByteString *)
                               CONCAT17(in_stack_fffffffffffff78f,
                                        CONCAT16(in_stack_fffffffffffff78e,in_stack_fffffffffffff788
                                                )));
                  }
                  else {
                    pBVar7 = DSAParameters::getP(local_78);
                    Token::encrypt((Token *)this_00,(char *)pBVar7,(int)local_548);
                    in_stack_fffffffffffff7e8 = local_48;
                    in_stack_fffffffffffff7f0 = (HandleManager *)DSAParameters::getQ(local_78);
                    Token::encrypt((Token *)in_stack_fffffffffffff7e8,
                                   (char *)in_stack_fffffffffffff7f0,(int)local_570);
                    in_stack_fffffffffffff7d8 = local_48;
                    pBVar7 = DSAParameters::getG(local_78);
                    Token::encrypt((Token *)in_stack_fffffffffffff7d8,(char *)pBVar7,
                                   (int)&stack0xfffffffffffffa68);
                  }
                  pOVar2 = local_3b0;
                  local_639 = 0;
                  bVar11 = 0;
                  if ((local_3b1 & 1) != 0) {
                    OSAttribute::OSAttribute
                              (in_stack_fffffffffffff7c0,
                               (ByteString *)(ulong)in_stack_fffffffffffff7b8);
                    local_639 = 1;
                    iVar3 = (*pOVar2->_vptr_OSAttribute[8])(pOVar2,0x130,local_638);
                    bVar11 = (byte)iVar3;
                  }
                  local_3b1 = bVar11 & 1;
                  if ((local_639 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_fffffffffffff790);
                  }
                  pOVar2 = local_3b0;
                  local_6e1 = 0;
                  local_852 = 0;
                  if ((local_3b1 & 1) != 0) {
                    OSAttribute::OSAttribute
                              (in_stack_fffffffffffff7c0,
                               (ByteString *)CONCAT17(bVar11,in_stack_fffffffffffff7b8));
                    local_6e1 = 1;
                    iVar3 = (*pOVar2->_vptr_OSAttribute[8])(pOVar2,0x131,local_6e0);
                    local_852 = (byte)iVar3;
                  }
                  local_3b1 = local_852 & 1;
                  if ((local_6e1 & 1) != 0) {
                    OSAttribute::~OSAttribute(in_stack_fffffffffffff790);
                  }
                  bVar10 = (local_3b1 & 1) != 0;
                  local_862 = 0;
                  if (bVar10) {
                    in_stack_fffffffffffff790 = local_3b0;
                    OSAttribute::OSAttribute
                              (in_stack_fffffffffffff7c0,
                               (ByteString *)CONCAT17(bVar11,in_stack_fffffffffffff7b8));
                    iVar3 = (*in_stack_fffffffffffff790->_vptr_OSAttribute[8])
                                      (in_stack_fffffffffffff790,0x132,local_788);
                    local_862 = (byte)iVar3;
                  }
                  local_3b1 = local_862 & 1;
                  if (bVar10) {
                    OSAttribute::~OSAttribute(in_stack_fffffffffffff790);
                  }
                  if ((local_3b1 & 1) == 0) {
                    (*local_3b0->_vptr_OSAttribute[0xd])();
                  }
                  else {
                    iVar3 = (*local_3b0->_vptr_OSAttribute[0xc])();
                    local_3b1 = (byte)iVar3 & 1;
                  }
                  if ((local_3b1 & 1) == 0) {
                    local_80 = 6;
                  }
                  ByteString::~ByteString((ByteString *)0x175fc4);
                  ByteString::~ByteString((ByteString *)0x175fd1);
                  ByteString::~ByteString((ByteString *)0x175fde);
                }
              }
            }
            (**(code **)(*local_70 + 200))(local_70,local_68);
            pCVar5 = CryptoFactory::i();
            (*pCVar5->_vptr_CryptoFactory[3])(pCVar5,local_70);
            if ((local_80 != 0) && (*local_30 != 0)) {
              plVar8 = (long *)HandleManager::getObject
                                         (in_stack_fffffffffffff7d8,
                                          (CK_OBJECT_HANDLE)in_stack_fffffffffffff7d0);
              HandleManager::destroyObject
                        (in_stack_fffffffffffff7f0,(CK_OBJECT_HANDLE)in_stack_fffffffffffff7e8);
              if (plVar8 != (long *)0x0) {
                (**(code **)(*plVar8 + 0x70))();
              }
              *local_30 = 0;
            }
            local_8 = local_80;
          }
        }
      }
    }
  }
  return local_8;
}

Assistant:

CK_RV SoftHSM::generateDSAParameters
(CK_SESSION_HANDLE hSession,
	CK_ATTRIBUTE_PTR pTemplate,
	CK_ULONG ulCount,
	CK_OBJECT_HANDLE_PTR phKey,
	CK_BBOOL isOnToken,
	CK_BBOOL isPrivate)
{
	*phKey = CK_INVALID_HANDLE;

	// Get the session
	Session* session = (Session*)handleManager->getSession(hSession);
	if (session == NULL)
		return CKR_SESSION_HANDLE_INVALID;

	// Get the token
	Token* token = session->getToken();
	if (token == NULL)
		return CKR_GENERAL_ERROR;

	// Extract desired parameter information
	size_t bitLen = 0;
	size_t qLen = 0;
	for (CK_ULONG i = 0; i < ulCount; i++)
	{
		switch (pTemplate[i].type)
		{
			case CKA_PRIME_BITS:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_PRIME_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				bitLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			case CKA_SUB_PRIME_BITS:
				if (pTemplate[i].ulValueLen != sizeof(CK_ULONG))
				{
					INFO_MSG("CKA_SUB_PRIME_BITS does not have the size of CK_ULONG");
					return CKR_ATTRIBUTE_VALUE_INVALID;
				}
				qLen = *(CK_ULONG*)pTemplate[i].pValue;
				break;
			default:
				break;
		}
	}

	// CKA_PRIME_BITS must be specified
	if (bitLen == 0)
	{
		INFO_MSG("Missing CKA_PRIME_BITS in pTemplate");
		return CKR_TEMPLATE_INCOMPLETE;
	}

	// No real choice for CKA_SUB_PRIME_BITS
	if ((qLen != 0) &&
	    (((bitLen >= 2048) && (qLen != 256)) ||
	     ((bitLen < 2048) && (qLen != 160))))
		INFO_MSG("CKA_SUB_PRIME_BITS is ignored");


	// Generate domain parameters
	AsymmetricParameters* p = NULL;
	AsymmetricAlgorithm* dsa = CryptoFactory::i()->getAsymmetricAlgorithm(AsymAlgo::DSA);
	if (dsa == NULL) return CKR_GENERAL_ERROR;
	if (!dsa->generateParameters(&p, (void *)bitLen))
	{
		ERROR_MSG("Could not generate parameters");
		CryptoFactory::i()->recycleAsymmetricAlgorithm(dsa);
		return CKR_GENERAL_ERROR;
	}

	DSAParameters* params = (DSAParameters*) p;

	CK_RV rv = CKR_OK;

	// Create the domain parameter object using C_CreateObject
	const CK_ULONG maxAttribs = 32;
	CK_OBJECT_CLASS objClass = CKO_DOMAIN_PARAMETERS;
	CK_KEY_TYPE keyType = CKK_DSA;
	CK_ATTRIBUTE paramsAttribs[maxAttribs] = {
		{ CKA_CLASS, &objClass, sizeof(objClass) },
		{ CKA_TOKEN, &isOnToken, sizeof(isOnToken) },
		{ CKA_PRIVATE, &isPrivate, sizeof(isPrivate) },
		{ CKA_KEY_TYPE, &keyType, sizeof(keyType) },
	};
	CK_ULONG paramsAttribsCount = 4;

	// Add the additional
	if (ulCount > (maxAttribs - paramsAttribsCount))
		rv = CKR_TEMPLATE_INCONSISTENT;
	for (CK_ULONG i=0; i < ulCount && rv == CKR_OK; ++i)
	{
		switch (pTemplate[i].type)
		{
			case CKA_CLASS:
			case CKA_TOKEN:
			case CKA_PRIVATE:
			case CKA_KEY_TYPE:
				continue;
		default:
			paramsAttribs[paramsAttribsCount++] = pTemplate[i];
		}
	}

	if (rv == CKR_OK)
		rv = this->CreateObject(hSession, paramsAttribs, paramsAttribsCount, phKey,OBJECT_OP_GENERATE);

	// Store the attributes that are being supplied
	if (rv == CKR_OK)
	{
		OSObject* osobject = (OSObject*)handleManager->getObject(*phKey);
		if (osobject == NULL_PTR || !osobject->isValid()) {
			rv = CKR_FUNCTION_FAILED;
		} else if (osobject->startTransaction()) {
			bool bOK = true;

			// Common Attributes
			bOK = bOK && osobject->setAttribute(CKA_LOCAL,true);
			CK_ULONG ulKeyGenMechanism = (CK_ULONG)CKM_DSA_PARAMETER_GEN;
			bOK = bOK && osobject->setAttribute(CKA_KEY_GEN_MECHANISM,ulKeyGenMechanism);

			// DSA Domain Parameters Attributes
			ByteString prime;
			ByteString subprime;
			ByteString generator;
			if (isPrivate)
			{
				token->encrypt(params->getP(), prime);
				token->encrypt(params->getQ(), subprime);
				token->encrypt(params->getG(), generator);
			}
			else
			{
				prime = params->getP();
				subprime = params->getQ();
				generator = params->getG();
			}
			bOK = bOK && osobject->setAttribute(CKA_PRIME, prime);
			bOK = bOK && osobject->setAttribute(CKA_SUBPRIME, subprime);
			bOK = bOK && osobject->setAttribute(CKA_BASE, generator);

			if (bOK)
				bOK = osobject->commitTransaction();
			else
				osobject->abortTransaction();

			if (!bOK)
				rv = CKR_FUNCTION_FAILED;
		} else
			rv = CKR_FUNCTION_FAILED;
	}

	// Clean up
	dsa->recycleParameters(p);
	CryptoFactory::i()->recycleAsymmetricAlgorithm(dsa);

	// Remove parameters that may have been created already when the function fails.
	if (rv != CKR_OK)
	{
		if (*phKey != CK_INVALID_HANDLE)
		{
			OSObject* osparams = (OSObject*)handleManager->getObject(*phKey);
			handleManager->destroyObject(*phKey);
			if (osparams) osparams->destroyObject();
			*phKey = CK_INVALID_HANDLE;
		}
	}

	return rv;
}